

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasJumpType op_mvcle(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx_00;
  uint val;
  uint val_00;
  TCGv_i32 arg2;
  TCGv_i32 arg4;
  TCGv_i32 t3;
  TCGv_i32 t1;
  int r3;
  int r1;
  TCGContext_conflict12 *tcg_ctx;
  DisasOps *o_local;
  DisasContext_conflict13 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  val = get_field1(s,FLD_O_r1,FLD_C_b1);
  val_00 = get_field1(s,FLD_O_r3,FLD_C_i3);
  if (((val & 1) == 0) && ((val_00 & 1) == 0)) {
    arg2 = tcg_const_i32_s390x(tcg_ctx_00,val);
    arg4 = tcg_const_i32_s390x(tcg_ctx_00,val_00);
    gen_helper_mvcle(tcg_ctx_00,tcg_ctx_00->cc_op,tcg_ctx_00->cpu_env,arg2,o->in2,arg4);
    tcg_temp_free_i32(tcg_ctx_00,arg2);
    tcg_temp_free_i32(tcg_ctx_00,arg4);
    set_cc_static(s);
    s_local._4_4_ = DISAS_NEXT;
  }
  else {
    gen_program_exception(s,6);
    s_local._4_4_ = DISAS_NORETURN;
  }
  return s_local._4_4_;
}

Assistant:

static DisasJumpType op_mvcle(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int r1 = get_field(s, r1);
    int r3 = get_field(s, r3);
    TCGv_i32 t1, t3;

    /* r1 and r3 must be even.  */
    if (r1 & 1 || r3 & 1) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    t1 = tcg_const_i32(tcg_ctx, r1);
    t3 = tcg_const_i32(tcg_ctx, r3);
    gen_helper_mvcle(tcg_ctx, tcg_ctx->cc_op, tcg_ctx->cpu_env, t1, o->in2, t3);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t3);
    set_cc_static(s);
    return DISAS_NEXT;
}